

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

TidyOptionId getOptionReplacement(ctmbstr optName)

{
  int iVar1;
  ctmbstr testName;
  uint i;
  ctmbstr optName_local;
  
  testName._4_4_ = 0;
  while( true ) {
    if (deprecatedOptions[testName._4_4_].name == (ctmbstr)0x0) {
      return N_TIDY_OPTIONS;
    }
    iVar1 = prvTidytmbstrcasecmp(optName,deprecatedOptions[testName._4_4_].name);
    if (iVar1 == 0) break;
    testName._4_4_ = testName._4_4_ + 1;
  }
  return deprecatedOptions[testName._4_4_].replacementId;
}

Assistant:

static TidyOptionId getOptionReplacement( ctmbstr optName )
{
    uint i = 0;
    ctmbstr testName;
    while ( (testName = deprecatedOptions[i].name) )
    {
        if ( TY_(tmbstrcasecmp)( optName, testName ) == 0 )
            return deprecatedOptions[i].replacementId;

        i++;
    }
    return N_TIDY_OPTIONS;
}